

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *node,Reader *replacement)

{
  bool bVar1;
  Which WVar2;
  uint uVar3;
  uint uVar4;
  uint64_t scopeId;
  uint64_t replacementScopeId;
  Reader local_308;
  Reader local_2d8;
  Reader local_2a8;
  Reader local_278;
  Reader local_248;
  Reader local_218;
  Reader local_1e8;
  Reader local_1b8;
  Reader local_188;
  Reader local_158;
  Reader local_120;
  Reader local_f0;
  Reader local_c0;
  Reader local_90;
  Fault local_50;
  Fault f;
  undefined1 local_40 [8];
  DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which> _kjCondition;
  Reader *replacement_local;
  Reader *node_local;
  CompatibilityChecker *this_local;
  
  _kjCondition._24_8_ = replacement;
  f.exception._4_2_ = capnp::schema::Node::Reader::which(node);
  f.exception._6_2_ =
       kj::_::DebugExpressionStart::operator<<
                 ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(Which *)((long)&f.exception + 4));
  f.exception._2_2_ = capnp::schema::Node::Reader::which((Reader *)_kjCondition._24_8_);
  kj::_::DebugExpression<capnp::schema::Node::Which>::operator==
            ((DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which> *)local_40,
             (DebugExpression<capnp::schema::Node::Which> *)((long)&f.exception + 6),
             (Which *)((long)&f.exception + 2));
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_40);
  if (bVar1) {
    capnp::schema::Node::Reader::getParameters(&local_90,(Reader *)_kjCondition._24_8_);
    uVar3 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size(&local_90);
    capnp::schema::Node::Reader::getParameters(&local_c0,node);
    uVar4 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size(&local_c0);
    if (uVar4 < uVar3) {
      replacementIsNewer(this);
    }
    else {
      capnp::schema::Node::Reader::getParameters(&local_f0,(Reader *)_kjCondition._24_8_);
      uVar3 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size(&local_f0);
      capnp::schema::Node::Reader::getParameters(&local_120,node);
      uVar4 = List<capnp::schema::Node::Parameter,_(capnp::Kind)3>::Reader::size(&local_120);
      if (uVar3 < uVar4) {
        replacementIsOlder(this);
      }
    }
    WVar2 = capnp::schema::Node::Reader::which(node);
    switch(WVar2) {
    case FILE:
      capnp::schema::Node::Reader::getFile(node);
      verifyVoid();
      break;
    case STRUCT:
      capnp::schema::Node::Reader::getStruct(&local_158,node);
      capnp::schema::Node::Reader::getStruct(&local_188,(Reader *)_kjCondition._24_8_);
      scopeId = capnp::schema::Node::Reader::getScopeId(node);
      replacementScopeId = capnp::schema::Node::Reader::getScopeId((Reader *)_kjCondition._24_8_);
      checkCompatibility(this,&local_158,&local_188,scopeId,replacementScopeId);
      break;
    case ENUM:
      capnp::schema::Node::Reader::getEnum(&local_1b8,node);
      capnp::schema::Node::Reader::getEnum(&local_1e8,(Reader *)_kjCondition._24_8_);
      checkCompatibility(this,&local_1b8,&local_1e8);
      break;
    case INTERFACE:
      capnp::schema::Node::Reader::getInterface(&local_218,node);
      capnp::schema::Node::Reader::getInterface(&local_248,(Reader *)_kjCondition._24_8_);
      checkCompatibility(this,&local_218,&local_248);
      break;
    case CONST:
      capnp::schema::Node::Reader::getConst(&local_278,node);
      capnp::schema::Node::Reader::getConst(&local_2a8,(Reader *)_kjCondition._24_8_);
      checkCompatibility(this,&local_278,&local_2a8);
      break;
    case ANNOTATION:
      capnp::schema::Node::Reader::getAnnotation(&local_2d8,node);
      capnp::schema::Node::Reader::getAnnotation(&local_308,(Reader *)_kjCondition._24_8_);
      checkCompatibility(this,&local_2d8,&local_308);
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Node::Which,capnp::schema::Node::Which>&,char_const(&)[28]>
              (&local_50,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x2c1,FAILED,"node.which() == replacement.which()",
               "_kjCondition,\"kind of declaration changed\"",
               (DebugComparison<capnp::schema::Node::Which,_capnp::schema::Node::Which> *)local_40,
               (char (*) [28])"kind of declaration changed");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&local_50);
  }
  return;
}

Assistant:

void checkCompatibility(const schema::Node::Reader& node,
                          const schema::Node::Reader& replacement) {
    // Returns whether `replacement` is equivalent, older than, newer than, or incompatible with
    // `node`.  If exceptions are enabled, this will throw an exception on INCOMPATIBLE.

    VALIDATE_SCHEMA(node.which() == replacement.which(),
                    "kind of declaration changed");

    // No need to check compatibility of most of the non-body parts of the node:
    // - Arbitrary renaming and moving between scopes is allowed.
    // - Annotations are ignored for compatibility purposes.

    if (replacement.getParameters().size() > node.getParameters().size()) {
      replacementIsNewer();
    } else if (replacement.getParameters().size() < node.getParameters().size()) {
      replacementIsOlder();
    }

    switch (node.which()) {
      case schema::Node::FILE:
        verifyVoid(node.getFile());
        break;
      case schema::Node::STRUCT:
        checkCompatibility(node.getStruct(), replacement.getStruct(),
                           node.getScopeId(), replacement.getScopeId());
        break;
      case schema::Node::ENUM:
        checkCompatibility(node.getEnum(), replacement.getEnum());
        break;
      case schema::Node::INTERFACE:
        checkCompatibility(node.getInterface(), replacement.getInterface());
        break;
      case schema::Node::CONST:
        checkCompatibility(node.getConst(), replacement.getConst());
        break;
      case schema::Node::ANNOTATION:
        checkCompatibility(node.getAnnotation(), replacement.getAnnotation());
        break;
    }
  }